

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

bool __thiscall
metaf::VisibilityGroup::appendFraction(VisibilityGroup *this,string *group,IncompleteText next)

{
  long lVar1;
  bool bVar2;
  optional<metaf::Distance> v;
  optional<metaf::Distance> d;
  
  bVar2 = false;
  lVar1 = std::__cxx11::string::find((char)group,0x2f);
  if (lVar1 != -1) {
    Distance::fromMileString(&v,group,true);
    if ((v.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::Distance>._M_engaged == true) &&
       ((((this->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_engaged == false &&
         (1 < (this->vis).distModifier - DISTANT)) ||
        (Distance::fromIntegerAndFraction(&d,&this->vis,(Distance *)&v),
        v.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::Distance>._M_payload._M_value.distModifier =
             d.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Distance>._M_payload._M_value.distModifier,
        v.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
        super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload =
             d.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
             super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_payload,
        v.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::Distance>._M_payload._8_4_ =
             d.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Distance>._M_payload._8_4_,
        v.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::Distance>._M_payload._M_value.distUnit =
             d.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Distance>._M_payload._M_value.distUnit,
        d.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
        super__Optional_payload_base<metaf::Distance>._M_engaged == true)))) {
      (this->vis).distModifier =
           v.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::Distance>._M_payload._M_value.distModifier;
      (this->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload =
           v.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
           super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_payload;
      *(undefined4 *)
       &(this->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged =
           v.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::Distance>._M_payload._8_4_;
      (this->vis).distUnit =
           v.super__Optional_base<metaf::Distance,_true,_true>._M_payload.
           super__Optional_payload_base<metaf::Distance>._M_payload._M_value.distUnit;
      this->incompleteText = next;
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool VisibilityGroup::appendFraction(const std::string & group, IncompleteText next) {
	if (group.find('/') == std::string::npos) return false;
	const auto v = Distance::fromMileString(group, true);
	if (!v.has_value()) return false;
	if (vis.isReported()) {
		const auto d = Distance::fromIntegerAndFraction(vis, std::move(*v));
		if (!d.has_value()) return false;
		vis = std::move(*d);
	} else {
		vis = std::move(*v);
	}
	incompleteText = next;
	return true;
}